

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O1

void __thiscall
tonk::SDKConnectionList<MyServerConnection>::Remove
          (SDKConnectionList<MyServerConnection> *this,SDKConnection *connection)

{
  __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
  __last;
  int iVar1;
  __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
  _Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    _Var2._M_current =
         (this->ConnectionList).
         super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->ConnectionList).
         super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var2._M_current != __last._M_current) {
      _Var2 = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<tonk::SDKConnection>*,std::vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>>,__gnu_cxx::__ops::_Iter_pred<tonk::SDKConnectionList<MyServerConnection>::Remove(tonk::SDKConnection*)::_lambda(std::shared_ptr<tonk::SDKConnection>const&)_1_>>
                        (_Var2,__last,
                         (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk___TonkCppSDK_h:522:17)>
                          )connection);
      std::
      vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
      ::_M_erase(&this->ConnectionList,(iterator)_Var2._M_current,
                 (this->ConnectionList).
                 super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Remove(SDKConnection* connection)
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);
        if (ConnectionList.empty()) {
            return;
        }
        ConnectionList.erase(
            std::remove_if(ConnectionList.begin(), ConnectionList.end(),
                [connection](std::shared_ptr<SDKConnection> const& i)
        {
            return i.get() == connection;
        }), ConnectionList.end());
    }